

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlOutputBufferWrite(xmlOutputBufferPtr out,int len,char *buf)

{
  xmlOutputWriteCallback p_Var1;
  void *pvVar2;
  int iVar3;
  xmlBufPtr pxVar4;
  size_t sVar5;
  xmlChar *pxVar6;
  int local_3c;
  int local_38;
  int local_34;
  int chunk;
  int written;
  int ret;
  int nbchars;
  char *buf_local;
  int len_local;
  xmlOutputBufferPtr out_local;
  
  local_34 = 0;
  if ((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) {
    out_local._4_4_ = -1;
  }
  else if (len < 0) {
    out_local._4_4_ = 0;
  }
  else {
    _ret = (xmlChar *)buf;
    buf_local._4_4_ = len;
    if (out->error == 0) {
      do {
        local_38 = buf_local._4_4_;
        if (16000 < buf_local._4_4_) {
          local_38 = 16000;
        }
        if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
          iVar3 = xmlBufAdd(out->buffer,_ret,local_38);
          if (iVar3 != 0) {
            return -1;
          }
          if (out->writecallback == (xmlOutputWriteCallback)0x0) {
            written = local_38;
          }
          else {
            sVar5 = xmlBufUse(out->buffer);
            written = (int)sVar5;
          }
        }
        else {
          if (out->conv == (xmlBufPtr)0x0) {
            pxVar4 = xmlBufCreate();
            out->conv = pxVar4;
          }
          iVar3 = xmlBufAdd(out->buffer,_ret,local_38);
          if (iVar3 != 0) {
            return -1;
          }
          sVar5 = xmlBufUse(out->buffer);
          if ((sVar5 < 4000) && (local_38 == buf_local._4_4_)) break;
          local_3c = xmlCharEncOutput(out,0);
          if ((local_3c < 0) && (local_3c != -3)) {
            xmlIOErr(0x608,(char *)0x0);
            out->error = 0x608;
            return -1;
          }
          if (out->writecallback == (xmlOutputWriteCallback)0x0) {
            if (local_3c < 0) {
              local_3c = 0;
            }
            written = local_3c;
          }
          else {
            sVar5 = xmlBufUse(out->conv);
            written = (int)sVar5;
          }
        }
        _ret = _ret + local_38;
        buf_local._4_4_ = buf_local._4_4_ - local_38;
        if (out->writecallback != (xmlOutputWriteCallback)0x0) {
          if ((written < 4000) && (buf_local._4_4_ < 1)) break;
          if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
            p_Var1 = out->writecallback;
            pvVar2 = out->context;
            pxVar6 = xmlBufContent(out->buffer);
            chunk = (*p_Var1)(pvVar2,(char *)pxVar6,written);
            if (-1 < chunk) {
              xmlBufShrink(out->buffer,(long)chunk);
            }
          }
          else {
            p_Var1 = out->writecallback;
            pvVar2 = out->context;
            pxVar6 = xmlBufContent(out->conv);
            chunk = (*p_Var1)(pvVar2,(char *)pxVar6,written);
            if (-1 < chunk) {
              xmlBufShrink(out->conv,(long)chunk);
            }
          }
          if (chunk < 0) {
            xmlIOErr(0x60a,(char *)0x0);
            out->error = 0x60a;
            return chunk;
          }
          if (0x7fffffff - chunk < out->written) {
            out->written = 0x7fffffff;
          }
          else {
            out->written = chunk + out->written;
          }
        }
        local_34 = written + local_34;
      } while (0 < buf_local._4_4_);
      out_local._4_4_ = local_34;
    }
    else {
      out_local._4_4_ = -1;
    }
  }
  return out_local._4_4_;
}

Assistant:

int
xmlOutputBufferWrite(xmlOutputBufferPtr out, int len, const char *buf) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int chunk;       /* number of byte current processed from buf */

    if ((out == NULL) || (out->error)) return(-1);
    if (len < 0) return(0);
    if (out->error) return(-1);

    do {
	chunk = len;
	if (chunk > 4 * MINLEN)
	    chunk = 4 * MINLEN;

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (chunk == len))
		goto done;

	    /*
	     * convert as much as possible to the parser reading buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            if (out->writecallback)
	        nbchars = xmlBufUse(out->conv);
            else
                nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);
            if (out->writecallback)
	        nbchars = xmlBufUse(out->buffer);
            else
                nbchars = chunk;
	}
	buf += chunk;
	len -= chunk;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	}
	written += nbchars;
    } while (len > 0);

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}